

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_merge_sort(int64_t *dst,size_t size)

{
  int64_t *in_RSI;
  int64_t *newdst;
  size_t in_stack_ffffffffffffffe8;
  
  if ((int64_t *)0x1 < in_RSI) {
    if (in_RSI < (int64_t *)0x11) {
      sorter_binary_insertion_sort(in_RSI,in_stack_ffffffffffffffe8);
    }
    else {
      sorter_sort_new_buffer(0x10a9eb);
      sorter_merge_sort_recursive(dst,(int64_t *)size,(size_t)newdst);
      sorter_sort_delete_buffer((int64_t *)0x10aa0b);
    }
  }
  return;
}

Assistant:

void MERGE_SORT(SORT_TYPE *dst, const size_t size) {
  SORT_TYPE *newdst;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  if (size <= SMALL_SORT_BND) {
    BINARY_INSERTION_SORT(dst, size);
    return;
  }

  newdst = SORT_NEW_BUFFER(size);
  MERGE_SORT_RECURSIVE(newdst, dst, size);
  SORT_DELETE_BUFFER(newdst);
}